

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heap2Local.cpp
# Opt level: O3

void __thiscall
wasm::anon_unknown_23::Struct2Local::Struct2Local
          (Struct2Local *this,StructNew *allocation,EscapeAnalyzer *analyzer,Function *func,
          Module *wasm)

{
  pointer pFVar1;
  iterator __position;
  size_t sVar2;
  pointer pTVar3;
  pointer pTVar4;
  undefined1 auVar5 [16];
  Index IVar6;
  Struct *pSVar7;
  TaskFunc p_Var8;
  long lVar9;
  Expression **ppEVar10;
  pointer pFVar11;
  ReFinalize local_1a8;
  Module *local_40;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .replacep = (Expression **)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.usedFixed = 0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .stack.flexible.
  super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .currFunction = (Function *)0x0;
  (this->
  super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  ).
  super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
  .currModule = (Module *)0x0;
  this->allocation = allocation;
  this->analyzer = analyzer;
  this->func = func;
  this->wasm = wasm;
  (this->builder).wasm = wasm;
  local_40 = wasm;
  local_1a8.
  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
  .super_Pass._vptr_Pass =
       (_func_int **)
       wasm::Type::getHeapType
                 (&(allocation->super_SpecificExpression<(wasm::Expression::Id)65>).super_Expression
                   .type);
  pSVar7 = HeapType::getStruct((HeapType *)&local_1a8);
  this->fields = &pSVar7->fields;
  local_38 = &this->localIndexes;
  (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  pFVar11 = (pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar1 = (pSVar7->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pFVar11 != pFVar1) {
    do {
      auVar5._8_8_ = 0;
      auVar5._0_8_ = (pFVar11->type).id;
      IVar6 = Builder::addVar((Builder *)func,(Function *)0x0,(Name)(auVar5 << 0x40),(Type)wasm);
      local_1a8.
      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
      .super_Pass._vptr_Pass =
           (_func_int **)
           CONCAT44(local_1a8.
                    super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                    .super_Pass._vptr_Pass._4_4_,IVar6);
      __position._M_current =
           (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                  (local_38,__position,(uint *)&local_1a8);
      }
      else {
        *__position._M_current = IVar6;
        (this->localIndexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pFVar11 = pFVar11 + 1;
    } while (pFVar11 != pFVar1);
  }
  if (((long)(this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start >> 4) +
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      .stack.usedFixed == 0) {
    Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
    ::pushTask((Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                *)this,PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                       ::scan,&func->body);
    sVar2 = (this->
            super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
            ).
            super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
            .stack.usedFixed;
    pTVar3 = (this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pTVar4 = (this->
             super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
             .stack.flexible.
             super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar9 = ((long)pTVar4 - (long)pTVar3 >> 4) + sVar2;
    while( true ) {
      if (lVar9 == 0) {
        if (this->refinalize == true) {
          ReFinalize::ReFinalize(&local_1a8);
          local_1a8.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          currModule = local_40;
          local_1a8.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          currFunction = func;
          Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
                    (&local_1a8.
                      super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                      .
                      super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                      .
                      super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                     ,&func->body);
          local_1a8.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          currFunction = (Function *)0x0;
          local_1a8.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
          currModule = (Module *)0x0;
          local_1a8.
          super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
          .super_Pass._vptr_Pass = (_func_int **)&PTR__ReFinalize_01070c30;
          std::
          _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&local_1a8.breakTypes._M_h);
          if (local_1a8.
              super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
              .super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.
              super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>.stack
              .flexible.
              super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_1a8.
                            super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                            .
                            super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .
                            super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                            .stack.flexible.
                            super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_1a8.
                                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                  .
                                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                                  .
                                  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_1a8.
                                  super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                                  .
                                  super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                                  .
                                  super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                                  .stack.flexible.
                                  super__Vector_base<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task,_std::allocator<wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::Task>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          Pass::~Pass((Pass *)&local_1a8);
        }
        return;
      }
      if (pTVar3 == pTVar4) {
        if (sVar2 == 0) {
          __assert_fail("usedFixed > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                        ,0x7e,
                        "T &wasm::SmallVector<wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::Task, 10>::back() [T = wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::Task, N = 10]"
                       );
        }
        p_Var8 = (this->
                 super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                 ).
                 super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                 .stack.fixed._M_elems[sVar2 - 1].func;
        ppEVar10 = (this->
                   super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                   ).
                   super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
                   .stack.fixed._M_elems[sVar2 - 1].currp;
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        .stack.usedFixed = sVar2 - 1;
      }
      else {
        p_Var8 = pTVar4[-1].func;
        ppEVar10 = pTVar4[-1].currp;
        (this->
        super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        ).
        super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
        .stack.flexible.
        super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_finish = pTVar4 + -1;
      }
      (this->
      super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      ).
      super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
      .replacep = ppEVar10;
      if (*ppEVar10 == (Expression *)0x0) break;
      (*p_Var8)(this,ppEVar10);
      sVar2 = (this->
              super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              ).
              super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
              .stack.usedFixed;
      pTVar3 = (this->
               super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               ).
               super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pTVar4 = (this->
               super_PostWalker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               ).
               super_Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>
               .stack.flexible.
               super__Vector_base<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task,_std::allocator<wasm::Walker<wasm::(anonymous_namespace)::Struct2Local,_wasm::Visitor<wasm::(anonymous_namespace)::Struct2Local,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar9 = ((long)pTVar4 - (long)pTVar3 >> 4) + sVar2;
    }
    __assert_fail("*task.currp",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                  ,0x132,
                  "void wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Struct2Local, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>]"
                 );
  }
  __assert_fail("stack.size() == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x12d,
                "void wasm::Walker<wasm::(anonymous namespace)::Struct2Local, wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>>::walk(Expression *&) [SubType = wasm::(anonymous namespace)::Struct2Local, VisitorType = wasm::Visitor<wasm::(anonymous namespace)::Struct2Local>]"
               );
}

Assistant:

Struct2Local(StructNew* allocation,
               EscapeAnalyzer& analyzer,
               Function* func,
               Module& wasm)
    : allocation(allocation), analyzer(analyzer), func(func), wasm(wasm),
      builder(wasm), fields(allocation->type.getHeapType().getStruct().fields) {

    // Allocate locals to store the allocation's fields in.
    for (auto field : fields) {
      localIndexes.push_back(builder.addVar(func, field.type));
    }

    // Replace the things we need to using the visit* methods.
    walk(func->body);

    if (refinalize) {
      ReFinalize().walkFunctionInModule(func, &wasm);
    }
  }